

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O2

iterator mapFdAcByIdx(int idx)

{
  _Base_ptr p_Var1;
  int iVar2;
  
  std::mutex::lock(&mapFdMutex);
  iVar2 = 0;
  for (p_Var1 = mapFd._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &mapFd._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[0x1d]._M_left != (_Base_ptr)0x0) {
      iVar2 = iVar2 + 1;
      if (iVar2 == idx) break;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&mapFdMutex);
  return (iterator)p_Var1;
}

Assistant:

mapLTFlightDataTy::iterator mapFdAcByIdx (int idx)
{
    // access guarded by the fd mutex
    std::lock_guard<std::mutex> lock (mapFdMutex);
    // let's find the i-th aircraft by looping over all flight data
    // and count those objects, which have an a/c
    int i = 0;
    for (mapLTFlightDataTy::iterator fdIter = mapFd.begin();
         fdIter != mapFd.end();
         ++fdIter)
    {
        if (fdIter->second.hasAc())         // has an a/c
            if ( ++i == idx )               // and it's the i-th!
                return fdIter;
    }
    
    // not found
    return mapFd.end();
}